

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upd7759.c
# Opt level: O2

void upd7759_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  char cVar1;
  int iVar2;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  uint uVar3;
  upd7759_state *chip;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  short sVar7;
  int iVar8;
  
  if (*(char *)((long)param + 0x61) == '\0') {
    sVar7 = *(short *)((long)param + 0x42);
  }
  else {
    sVar7 = 0;
  }
  uVar5 = *(uint *)((long)param + 0x24);
  uVar4 = *(uint *)((long)param + 0xc);
  __s = *outputs;
  __s_00 = outputs[1];
  if (*(char *)((long)param + 0x20) == '\0') {
    if (samples != 0) {
      memset(__s,0,(ulong)samples << 2);
      memset(__s_00,0,(ulong)samples << 2);
    }
  }
  else {
    iVar2 = *(int *)((long)param + 0x10);
    for (uVar6 = 0; uVar6 != samples; uVar6 = uVar6 + 1) {
      __s[uVar6] = (int)sVar7 << 7;
      __s_00[uVar6] = (int)sVar7 << 7;
      uVar4 = uVar4 + iVar2;
      if (*(char *)((long)param + 0x60) == '\0') {
        while( true ) {
          do {
            if ((*(long *)((long)param + 0x48) == 0) || (uVar4 < 0x100000)) goto LAB_0015831a;
            uVar3 = uVar4 >> 0x14;
            if ((int)uVar5 <= (int)(uVar4 >> 0x14)) {
              uVar3 = uVar5;
            }
            uVar4 = uVar4 + uVar3 * -0x100000;
            uVar5 = uVar5 - uVar3;
          } while (uVar5 != 0);
          advance_state((upd7759_state *)param);
          if (*(char *)((long)param + 0x20) == '\0') break;
          uVar5 = *(uint *)((long)param + 0x24);
          sVar7 = 0;
          if (*(char *)((long)param + 0x61) == '\0') {
            sVar7 = *(short *)((long)param + 0x42);
          }
        }
        uVar5 = 0;
      }
      else {
        iVar8 = 4;
        while ((iVar8 != 0 && ((int)uVar5 <= iVar8))) {
          cVar1 = *(char *)((long)param + 0x17);
          advance_state((upd7759_state *)param);
          if ((cVar1 != *(char *)((long)param + 0x17)) &&
             (*(code **)((long)param + 0x18) != (code *)0x0)) {
            (**(code **)((long)param + 0x18))(param);
          }
          iVar8 = iVar8 - uVar5;
          uVar5 = *(uint *)((long)param + 0x24);
        }
        uVar5 = uVar5 - iVar8;
      }
LAB_0015831a:
    }
  }
  *(uint *)((long)param + 0x24) = uVar5;
  *(uint *)((long)param + 0xc) = uVar4;
  return;
}

Assistant:

static void upd7759_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	upd7759_state *chip = (upd7759_state *)param;
	UINT32 i;
	INT32 clocks_left = chip->clocks_left;
	INT16 sample = chip->Muted ? 0 : chip->sample;
	UINT32 step = chip->step;
	UINT32 pos = chip->pos;
	DEV_SMPL *buffer = outputs[0];
	DEV_SMPL *buffer2 = outputs[1];

	/* loop until done */
	i = 0;
	if (chip->state != STATE_IDLE)
		for (; i < samples; i++)
		{
			/* store the current sample */
			buffer[i] = sample << 7;
			buffer2[i] = sample << 7;

			/* advance by the number of clocks/output sample */
			pos += step;

			/* handle clocks, but only in standalone mode */
			if (! chip->ChipMode)
			{
				while (chip->rom && pos >= FRAC_ONE)
				{
					int clocks_this_time = pos >> FRAC_BITS;
					if (clocks_this_time > clocks_left)
						clocks_this_time = clocks_left;

					/* clock once */
					pos -= clocks_this_time * FRAC_ONE;
					clocks_left -= clocks_this_time;

					/* if we're out of clocks, time to handle the next state */
					if (clocks_left == 0)
					{
						/* advance one state; if we hit idle, bail */
						advance_state(chip);
						if (chip->state == STATE_IDLE)
							break;

						/* reimport the variables that we cached */
						clocks_left = chip->clocks_left;
						sample = chip->Muted ? 0 : chip->sample;
					}
				}
			}
			else
			{
				// advance the state (4x because of Clock Divider /4)
				INT32 rem_clocks = 4;
				
				while(rem_clocks && clocks_left <= rem_clocks)
				{
					rem_clocks -= clocks_left;
					upd7759_slave_update(chip);
					clocks_left = chip->clocks_left;
				}
				clocks_left -= rem_clocks;
			}
		}

	/* if we got out early, just zap the rest of the buffer */
	if (i < samples)
	{
		samples -= i;
		memset(&buffer[i], 0, samples * sizeof(DEV_SMPL));
		memset(&buffer2[i], 0, samples * sizeof(DEV_SMPL));
	}

	/* flush the state back */
	chip->clocks_left = clocks_left;
	chip->pos = pos;
}